

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateInitializers
          (ImmutableMessageGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  long lVar2;
  ImmutableFieldGenerator *pIVar3;
  long lVar4;
  int i;
  long lVar5;
  
  lVar4 = 0;
  for (lVar5 = 0; pDVar1 = (this->super_MessageGenerator).descriptor_,
      lVar5 < *(int *)(pDVar1 + 0x2c); lVar5 = lVar5 + 1) {
    lVar2 = *(long *)(pDVar1 + 0x30);
    if (*(long *)(lVar2 + 0x60 + lVar4) == 0) {
      pIVar3 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (&this->field_generators_,(FieldDescriptor *)(lVar2 + lVar4));
      (*pIVar3->_vptr_ImmutableFieldGenerator[7])(pIVar3,printer);
    }
    lVar4 = lVar4 + 0xa8;
  }
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateInitializers(io::Printer* printer) {
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (!descriptor_->field(i)->containing_oneof()) {
      field_generators_.get(descriptor_->field(i))
          .GenerateInitializationCode(printer);
    }
  }
}